

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVApolynomialGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  uint uVar1;
  CVadjMemRec *pCVar2;
  CVdtpntMemRec **ppCVar3;
  CVdtpntMemRec *pCVar4;
  undefined8 *puVar5;
  sunrealtype *psVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  N_Vector **ppp_Var15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int newpoint;
  long indx;
  int local_ac;
  CVdtpntMemRec **local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  double local_88;
  ulong uStack_80;
  N_Vector local_78;
  N_Vector *local_70;
  sunrealtype local_68;
  double local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar21;
  
  pCVar2 = cv_mem->cv_adj_mem;
  uVar16 = 0;
  if ((yS != (N_Vector *)0x0) && (uVar16 = 0, pCVar2->ca_IMinterpSensi != 0)) {
    uVar16 = cv_mem->cv_Ns;
  }
  ppCVar3 = pCVar2->dt_mem;
  local_68 = t;
  iVar9 = CVAfindIndex(cv_mem,t,(long *)&local_60,&local_ac);
  auVar19 = local_98;
  if (iVar9 != 0) {
    return iVar9;
  }
  if (local_60 == 0.0) {
    puVar5 = (undefined8 *)(*ppCVar3)->content;
    N_VScale(0x3ff0000000000000,*puVar5,y);
    auVar19 = _DAT_00138040;
    if ((int)uVar16 < 1) {
      return 0;
    }
    psVar6 = cv_mem->cv_cvals;
    lVar11 = (ulong)uVar16 - 1;
    auVar17._8_4_ = (int)lVar11;
    auVar17._0_8_ = lVar11;
    auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar17 = auVar17 ^ _DAT_00138040;
    auVar23 = _DAT_00138030;
    do {
      bVar8 = auVar17._0_4_ < SUB164(auVar23 ^ auVar19,0);
      iVar9 = auVar17._4_4_;
      iVar10 = SUB164(auVar23 ^ auVar19,4);
      if ((bool)(~(iVar9 < iVar10 || iVar10 == iVar9 && bVar8) & 1)) {
        *(undefined8 *)((long)psVar6 + lVar11) = 0x3ff0000000000000;
      }
      if (iVar9 >= iVar10 && (iVar10 != iVar9 || !bVar8)) {
        *(undefined8 *)((long)psVar6 + lVar11 + 8) = 0x3ff0000000000000;
      }
      lVar12 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar12 + 2;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar11);
    iVar9 = N_VScaleVectorArray(uVar16,cv_mem->cv_cvals,puVar5[1],yS);
  }
  else {
    auVar24._0_8_ = ABS(ppCVar3[(long)local_60]->t - ppCVar3[(long)local_60 - 1]->t);
    auVar24._8_8_ = 0;
    if (pCVar2->ca_tfinal <= pCVar2->ca_tinitial) {
      uVar1 = *(uint *)((long)ppCVar3[(long)local_60 - 1]->content + 0x10);
      dVar14 = (double)(ulong)uVar1;
      if ((long)(int)uVar1 < pCVar2->ca_np - (long)local_60) {
        dVar22 = (double)(pCVar2->ca_np + ~(long)(int)uVar1);
      }
      else {
        dVar22 = (double)((long)local_60 - 1);
      }
    }
    else {
      dVar14 = (double)(long)*(int *)((long)ppCVar3[(long)local_60]->content + 0x10);
      dVar22 = dVar14;
      if ((long)dVar14 < (long)local_60) {
        dVar22 = local_60;
      }
    }
    iVar9 = SUB84(dVar14,0);
    local_a8 = ppCVar3;
    local_78 = y;
    local_70 = yS;
    if (local_ac != 0) {
      local_58 = auVar24;
      if (pCVar2->ca_tfinal <= pCVar2->ca_tinitial) {
        if (-1 < iVar9) {
          local_a8 = ppCVar3 + ((long)dVar22 - 1);
          local_88 = (double)(ulong)(iVar9 + 1);
          lVar11 = (ulong)uVar16 - 1;
          auVar19._8_4_ = (int)lVar11;
          auVar19._0_8_ = lVar11;
          auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar24._0_8_ = 0.0;
          local_98 = auVar19 ^ _DAT_00138040;
          do {
            pCVar4 = local_a8[(long)auVar24._0_8_];
            pCVar2->ca_T[(long)auVar24._0_8_] = pCVar4->t;
            puVar5 = (undefined8 *)pCVar4->content;
            N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[(long)auVar24._0_8_]);
            auVar19 = _DAT_00138040;
            if (0 < (int)uVar16) {
              psVar6 = cv_mem->cv_cvals;
              lVar11 = 0;
              auVar20 = _DAT_00138030;
              do {
                bVar8 = local_98._0_4_ < SUB164(auVar20 ^ auVar19,0);
                iVar10 = SUB164(auVar20 ^ auVar19,4);
                iVar25 = local_98._4_4_;
                if ((bool)(~(iVar25 < iVar10 || iVar10 == iVar25 && bVar8) & 1)) {
                  *(undefined8 *)((long)psVar6 + lVar11) = 0x3ff0000000000000;
                }
                if (iVar25 >= iVar10 && (iVar10 != iVar25 || !bVar8)) {
                  *(undefined8 *)((long)psVar6 + lVar11 + 8) = 0x3ff0000000000000;
                }
                lVar12 = auVar20._8_8_;
                auVar20._0_8_ = auVar20._0_8_ + 2;
                auVar20._8_8_ = lVar12 + 2;
                lVar11 = lVar11 + 0x10;
              } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar11);
              iVar10 = N_VScaleVectorArray(uVar16,cv_mem->cv_cvals,puVar5[1]);
              if (iVar10 != 0) {
                return -0x1c;
              }
            }
            auVar24._0_8_ = (double)((long)auVar24._0_8_ + 1);
          } while (auVar24._0_8_ != local_88);
        }
      }
      else if (-1 < iVar9) {
        local_98._4_4_ = 0;
        local_98._0_4_ = iVar9 + 1;
        local_98._8_8_ = auVar19._8_8_;
        lVar11 = (ulong)uVar16 - 1;
        local_48._8_4_ = (int)lVar11;
        local_48._0_8_ = lVar11;
        local_48._12_4_ = (int)((ulong)lVar11 >> 0x20);
        lVar11 = 0;
        local_48 = local_48 ^ _DAT_00138040;
        local_88 = dVar22;
        do {
          pCVar4 = local_a8[(long)local_88 - lVar11];
          pCVar2->ca_T[lVar11] = pCVar4->t;
          puVar5 = (undefined8 *)pCVar4->content;
          N_VScale(0x3ff0000000000000,*puVar5,pCVar2->ca_Y[lVar11]);
          auVar19 = _DAT_00138040;
          if (0 < (int)uVar16) {
            psVar6 = cv_mem->cv_cvals;
            lVar12 = 0;
            auVar18 = _DAT_00138030;
            do {
              bVar8 = local_48._0_4_ < SUB164(auVar18 ^ auVar19,0);
              iVar10 = SUB164(auVar18 ^ auVar19,4);
              iVar25 = local_48._4_4_;
              if ((bool)(~(iVar25 < iVar10 || iVar10 == iVar25 && bVar8) & 1)) {
                *(undefined8 *)((long)psVar6 + lVar12) = 0x3ff0000000000000;
              }
              if (iVar25 >= iVar10 && (iVar10 != iVar25 || !bVar8)) {
                *(undefined8 *)((long)psVar6 + lVar12 + 8) = 0x3ff0000000000000;
              }
              lVar21 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 2;
              auVar18._8_8_ = lVar21 + 2;
              lVar12 = lVar12 + 0x10;
            } while ((ulong)(uVar16 + 1 >> 1) << 4 != lVar12);
            iVar10 = N_VScaleVectorArray(uVar16,cv_mem->cv_cvals,puVar5[1]);
            if (iVar10 != 0) {
              return -0x1c;
            }
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_98._0_8_);
      }
      auVar19 = local_98;
      auVar24._0_8_ = (double)local_58._0_8_;
      if (0 < iVar9) {
        local_98._4_4_ = 0;
        local_98._0_4_ = iVar9 + 1;
        local_98._8_8_ = auVar19._8_8_;
        ppp_Var15 = pCVar2->ca_YS + 0xc;
        lVar11 = 1;
        uVar13 = (ulong)dVar14 & 0xffffffff;
        do {
          do {
            local_a8 = (CVdtpntMemRec **)
                       ((double)local_58._0_8_ / (pCVar2->ca_T[uVar13] - (double)ppp_Var15[uVar13]))
            ;
            local_88 = -(double)local_a8;
            uStack_80 = local_58._8_8_ ^ 0x8000000000000000;
            uStack_a0 = local_58._8_8_;
            N_VLinearSum(local_a8,pCVar2->ca_Y[uVar13],pCVar2->ca_Y[uVar13 - 1],pCVar2->ca_Y[uVar13]
                        );
            if ((0 < (int)uVar16) &&
               (iVar10 = N_VLinearSumVectorArray
                                   (local_a8,local_88,uVar16,pCVar2->ca_YS[uVar13],
                                    pCVar2->ca_Y[uVar13 + 0xc]), iVar10 != 0)) {
              return -0x1c;
            }
            bVar8 = lVar11 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar8);
          lVar11 = lVar11 + 1;
          ppp_Var15 = ppp_Var15 + -1;
          uVar13 = (ulong)dVar14 & 0xffffffff;
          auVar24._0_8_ = (double)local_58._0_8_;
        } while (lVar11 != local_98._0_8_);
      }
    }
    pdVar7 = cv_mem->cv_cvals;
    *pdVar7 = 1.0;
    if (0 < iVar9) {
      dVar22 = *pdVar7;
      uVar13 = 0;
      do {
        dVar22 = ((local_68 - pCVar2->ca_T[uVar13]) * dVar22) / auVar24._0_8_;
        pdVar7[uVar13 + 1] = dVar22;
        uVar13 = uVar13 + 1;
      } while (((ulong)dVar14 & 0xffffffff) != uVar13);
    }
    iVar10 = N_VLinearCombination(iVar9 + 1,pdVar7,pCVar2->ca_Y,local_78);
    if (iVar10 != 0) {
      return -0x1c;
    }
    if ((int)uVar16 < 1) {
      return 0;
    }
    iVar9 = N_VLinearCombinationVectorArray
                      (uVar16,iVar9 + 1,cv_mem->cv_cvals,pCVar2->ca_YS,local_70);
  }
  if (iVar9 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int CVApolynomialGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y,
                             N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int indx, base;
  sunbooleantype newpoint;
  sunrealtype dt, factor;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content = (CVpolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Scaling factor */

  dt = SUNRabs(dt_mem[indx]->t - dt_mem[indx - 1]->t);

  /* Find the direction of the forward integration */

  dir = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = indx;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (indx < order) { base += order - indx; }
  }
  else
  {
    base    = indx - 1;
    content = (CVpolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (ca_mem->ca_np - indx > order) { base -= indx + order - ca_mem->ca_np; }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        ca_mem->ca_T[j] = dt_mem[base - 1 + j]->t;
        content         = (CVpolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, ca_mem->ca_Y[j]);
        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content->yS,
                                       ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = dt / (ca_mem->ca_T[j] - ca_mem->ca_T[j - i]);
        N_VLinearSum(factor, ca_mem->ca_Y[j], -factor, ca_mem->ca_Y[j - 1],
                     ca_mem->ca_Y[j]);

        if (NS > 0)
        {
          retval = N_VLinearSumVectorArray(NS, factor, ca_mem->ca_YS[j],
                                           -factor, ca_mem->ca_YS[j - 1],
                                           ca_mem->ca_YS[j]);
          if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
        }
      }
    }
  }

  /* Perform the actual interpolation using nested multiplications */

  cv_mem->cv_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    cv_mem->cv_cvals[i + 1] = cv_mem->cv_cvals[i] * (t - ca_mem->ca_T[i]) / dt;
  }

  retval = N_VLinearCombination(order + 1, cv_mem->cv_cvals, ca_mem->ca_Y, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, cv_mem->cv_cvals,
                                             ca_mem->ca_YS, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}